

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  void *ptr_id;
  char *item_text;
  char *preview_value;
  ImVec2 local_58;
  ImGuiContext *local_50;
  void *local_48;
  ImVec2 local_40;
  char *local_38;
  
  local_50 = GImGui;
  local_38 = (char *)0x0;
  iVar3 = *current_item;
  local_48 = data;
  if (iVar3 < items_count && -1 < iVar3) {
    (*items_getter)(data,iVar3,&local_38);
  }
  if ((popup_max_height_in_items != -1) && (((local_50->NextWindowData).Flags & 0x10) == 0)) {
    local_58.x = 0.0;
    local_58.y = 0.0;
    if (popup_max_height_in_items < 1) {
      local_40.y = 3.4028235e+38;
    }
    else {
      fVar1 = (GImGui->Style).WindowPadding.y;
      fVar2 = (GImGui->Style).ItemSpacing.y;
      local_40.y = fVar1 + fVar1 +
                   ((float)popup_max_height_in_items * (GImGui->FontSize + fVar2) - fVar2);
    }
    local_40.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(&local_58,&local_40,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  bVar6 = false;
  bVar5 = BeginCombo(label,local_38,0);
  if (bVar5) {
    if (items_count < 1) {
      bVar6 = false;
    }
    else {
      ptr_id = (void *)0x0;
      bVar6 = false;
      do {
        PushID(ptr_id);
        uVar4 = *current_item;
        bVar5 = (*items_getter)(local_48,(int)ptr_id,(char **)&local_58);
        if (!bVar5) {
          local_58 = (ImVec2)0x1702f3;
        }
        local_40.x = 0.0;
        local_40.y = 0.0;
        bVar5 = Selectable((char *)local_58,ptr_id == (void *)(ulong)uVar4,0,&local_40);
        if (bVar5) {
          *current_item = (int)ptr_id;
          bVar6 = true;
        }
        if (ptr_id == (void *)(ulong)uVar4) {
          SetItemDefaultFocus();
        }
        PopID();
        ptr_id = (void *)((long)ptr_id + 1);
      } while ((void *)(ulong)(uint)items_count != ptr_id);
    }
    EndPopup();
    if (bVar6) {
      MarkItemEdited((local_50->CurrentWindow->DC).LastItemId);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0, 0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}